

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsTTDNotifyContextDestroy(JsContextRef context)

{
  bool bVar1;
  ThreadContext *this;
  ScriptContext *ctx_00;
  ScriptContext *ctx;
  ThreadContext *threadContext;
  JsContextRef context_local;
  
  this = ThreadContext::GetContextForCurrentThread();
  if ((this != (ThreadContext *)0x0) && (bVar1 = ThreadContext::IsRuntimeInTTDMode(this), bVar1)) {
    ctx_00 = JsrtContext::GetScriptContext((JsrtContext *)context);
    TTD::ThreadContextTTD::NotifyCtxDestroyInRecord(this->TTDContext,ctx_00);
  }
  return JsNoError;
}

Assistant:

CHAKRA_API JsTTDNotifyContextDestroy(_In_ JsContextRef context)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    ThreadContext* threadContext = ThreadContext::GetContextForCurrentThread();
    if(threadContext && threadContext->IsRuntimeInTTDMode())
    {
        Js::ScriptContext* ctx = static_cast<JsrtContext*>(context)->GetScriptContext();
        threadContext->TTDContext->NotifyCtxDestroyInRecord(ctx);
    }

    return JsNoError;
#endif
}